

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

void __thiscall cmDebugger_impl::~cmDebugger_impl(cmDebugger_impl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmDebugger)._vptr_cmDebugger = (_func_int **)&PTR_GetBacktrace_00688750;
  ClearListeners(this);
  (*(this->super_cmDebugger)._vptr_cmDebugger[0x14])(this);
  (*(this->super_cmDebugger)._vptr_cmDebugger[0x11])(this);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
  ::~_Rb_tree(&(this->activeWatchpoints)._M_t);
  pcVar2 = (this->currentLocation).FilePath._M_dataplus._M_p;
  paVar1 = &(this->currentLocation).FilePath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->currentLocation).Name._M_dataplus._M_p;
  paVar1 = &(this->currentLocation).Name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<cmDebuggerListener_*,_cmDebuggerListener_*,_std::_Identity<cmDebuggerListener_*>,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
  ::~_Rb_tree(&(this->listeners)._M_t);
  std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::~vector(&this->breakpoints);
  std::unique_lock<std::recursive_timed_mutex>::~unique_lock(&this->Lock);
  std::_V2::condition_variable_any::~condition_variable_any(&this->cv);
  return;
}

Assistant:

~cmDebugger_impl() override
  {
    ClearListeners();
    ClearAllWatchpoints();
    ClearAllBreakpoints();
  }